

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O2

void __thiscall
basisu::etc1_optimizer::refine_solution(etc1_optimizer *this,uint32_t max_refinement_trials)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  color_rgba cVar6;
  int iVar7;
  uint32_t uVar8;
  uchar *puVar9;
  uint uVar10;
  uint uVar11;
  uint32_t b;
  int iVar12;
  uint32_t g;
  uint32_t uVar13;
  uint32_t r;
  uint32_t uVar14;
  long lVar15;
  float fVar16;
  int iVar17;
  int iVar18;
  undefined4 in_XMM0_Dc;
  int iVar19;
  int iVar20;
  float fVar21;
  int iVar23;
  undefined1 auVar22 [16];
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  etc1_solution_coordinates local_3c;
  
  uVar2 = this->m_pParams->m_num_src_pixels;
  fVar16 = (float)uVar2;
  uVar14 = 0;
  while( true ) {
    if (uVar14 == max_refinement_trials) {
      return;
    }
    lVar15 = 0;
    puVar9 = vector<unsigned_char>::operator[](&(this->m_best_solution).m_selectors,0);
    uVar11 = (this->m_best_solution).m_coords.m_inten_table;
    cVar6 = etc1_solution_coordinates::get_scaled_color(&(this->m_best_solution).m_coords);
    auVar22._4_4_ = (uint)cVar6.field_0 >> 8;
    auVar22._0_4_ = cVar6.field_0;
    auVar22._8_8_ = 0;
    auVar34 = pmovzxbd(in_XMM3,0xffff);
    auVar22 = auVar22 & auVar34;
    uVar10 = (uint)cVar6.field_0 >> 0x10 & 0xff;
    iVar17 = 0;
    iVar18 = 0;
    iVar19 = 0;
    iVar20 = 0;
    iVar7 = 0;
    for (; uVar2 != (uint)lVar15; lVar15 = lVar15 + 1) {
      iVar12 = (&g_etc1_inten_tables)[(ulong)uVar11 * 4 + (ulong)puVar9[lVar15]];
      iVar23 = auVar22._8_4_;
      iVar24 = auVar22._12_4_;
      iVar25 = iVar12 + auVar22._0_4_;
      iVar30 = iVar12 + auVar22._4_4_;
      iVar3 = auVar34._0_4_;
      uVar26 = (uint)(iVar3 < iVar25) * iVar3 | (uint)(iVar3 >= iVar25) * iVar25;
      iVar3 = auVar34._4_4_;
      uVar31 = (uint)(iVar3 < iVar30) * iVar3 | (uint)(iVar3 >= iVar30) * iVar30;
      iVar3 = auVar34._8_4_;
      uVar32 = (uint)(iVar3 < iVar23) * iVar3 | (uint)(iVar3 >= iVar23) * iVar23;
      iVar3 = auVar34._12_4_;
      uVar33 = (uint)(iVar3 < iVar24) * iVar3 | (uint)(iVar3 >= iVar24) * iVar24;
      iVar12 = iVar12 + uVar10;
      if (0xfe < iVar12) {
        iVar12 = 0xff;
      }
      if (iVar12 < 1) {
        iVar12 = 0;
      }
      iVar17 = (iVar17 - auVar22._0_4_) + (-1 < (int)uVar26) * uVar26;
      iVar18 = (iVar18 - auVar22._4_4_) + (-1 < (int)uVar31) * uVar31;
      iVar19 = (iVar19 - iVar23) + (-1 < (int)uVar32) * uVar32;
      iVar20 = (iVar20 - iVar24) + (-1 < (int)uVar33) * uVar33;
      iVar7 = (iVar7 - uVar10) + iVar12;
    }
    auVar34._0_4_ = -(uint)(iVar17 == 0);
    auVar34._4_4_ = -(uint)(iVar18 == 0);
    auVar34._8_4_ = -(uint)(iVar19 == 0);
    auVar34._12_4_ = -(uint)(iVar20 == 0);
    auVar22 = pmovsxdq(auVar34 ^ _DAT_00309800,auVar34 ^ _DAT_00309800);
    uVar11 = movmskpd(uVar10,auVar22);
    if ((((uVar11 & 1) == 0) && ((byte)((byte)uVar11 >> 1) == 0)) && (iVar7 == 0)) break;
    auVar27._0_4_ = (float)iVar17;
    auVar27._4_4_ = (float)iVar18;
    auVar27._8_4_ = (float)iVar19;
    auVar27._12_4_ = (float)iVar20;
    b = this->m_limit;
    fVar21 = (float)(int)b;
    auVar4._4_4_ = fVar16;
    auVar4._0_4_ = fVar16;
    auVar4._8_4_ = in_XMM0_Dc;
    auVar4._12_4_ = in_XMM0_Dc;
    auVar34 = divps(auVar27,auVar4);
    uVar1 = *(undefined8 *)(this->m_avg_color).m_v;
    auVar35._0_4_ = (float)uVar1 - auVar34._0_4_;
    auVar35._4_4_ = (float)((ulong)uVar1 >> 0x20) - auVar34._4_4_;
    auVar35._8_4_ = 0.0 - auVar34._8_4_;
    auVar35._12_4_ = 0.0 - auVar34._12_4_;
    auVar28._0_4_ = fVar21 * auVar35._0_4_;
    auVar28._4_4_ = fVar21 * auVar35._4_4_;
    auVar28._8_4_ = auVar22._8_4_ * auVar35._8_4_;
    auVar28._12_4_ = auVar22._8_4_ * auVar35._12_4_;
    auVar22 = divps(auVar28,_DAT_002644e0);
    auVar29._0_4_ = (uint32_t)(auVar22._0_4_ + 0.5);
    auVar29._4_4_ = (uint32_t)(auVar22._4_4_ + 0.5);
    auVar29._8_4_ = (int)(auVar22._8_4_ + 0.0);
    auVar29._12_4_ = (int)(auVar22._12_4_ + 0.0);
    r = auVar29._0_4_;
    if ((int)b <= (int)auVar29._0_4_) {
      r = b;
    }
    in_XMM3 = pmovsxdq(auVar35,auVar29);
    uVar11 = movmskpd(iVar7,in_XMM3);
    uVar13 = 0;
    if ((uVar11 & 1) != 0) {
      r = uVar13;
    }
    g = auVar29._4_4_;
    if ((int)b <= (int)auVar29._4_4_) {
      g = b;
    }
    if ((uVar11 & 2) != 0) {
      g = uVar13;
    }
    uVar8 = (uint32_t)
            ((((this->m_avg_color).m_v[2] - (float)iVar7 / fVar16) * fVar21) / 255.0 + 0.5);
    if ((int)uVar8 < (int)b) {
      b = uVar8;
    }
    if ((int)uVar8 < 0) {
      b = uVar13;
    }
    etc1_solution_coordinates::etc1_solution_coordinates
              (&local_3c,r,g,b,0,this->m_pParams->m_use_color4);
    bVar5 = evaluate_solution(this,&local_3c,&this->m_trial_solution,&this->m_best_solution);
    uVar14 = uVar14 + 1;
    if (!bVar5) {
      return;
    }
  }
  return;
}

Assistant:

void etc1_optimizer::refine_solution(uint32_t max_refinement_trials)
	{
		// Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
		// Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
		// The goal is:
		// pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
		// Rearranging this:
		// (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
		// (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
		// (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
		// block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
		// So what this means:
		// optimal_block_color = avg_input - avg_inten_delta
		// So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
		// Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
		// Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

		const uint32_t n = m_pParams->m_num_src_pixels;

		for (uint32_t refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++)
		{
			const uint8_t* pSelectors = &m_best_solution.m_selectors[0];
			const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

			int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
			const color_rgba base_color(m_best_solution.m_coords.get_scaled_color());
			for (uint32_t r = 0; r < n; r++)
			{
				const uint32_t s = *pSelectors++;
				const int yd_temp = pInten_table[s];
				// Compute actual delta being applied to each pixel, taking into account clamping.
				delta_sum_r += clamp<int>(base_color.r + yd_temp, 0, 255) - base_color.r;
				delta_sum_g += clamp<int>(base_color.g + yd_temp, 0, 255) - base_color.g;
				delta_sum_b += clamp<int>(base_color.b + yd_temp, 0, 255) - base_color.b;
			}

			if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
				break;

			const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
			const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
			const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
			const int br1 = clamp<int>(static_cast<int32_t>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
			const int bg1 = clamp<int>(static_cast<int32_t>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
			const int bb1 = clamp<int>(static_cast<int32_t>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

#if BASISU_DEBUG_ETC_ENCODER_DEEPER
			printf("Refinement trial %u, avg_delta %f %f %f\n", refinement_trial, avg_delta_r_f, avg_delta_g_f, avg_delta_b_f);
#endif

			if (!evaluate_solution(etc1_solution_coordinates(br1, bg1, bb1, 0, m_pParams->m_use_color4), m_trial_solution, &m_best_solution))
				break;

		}  // refinement_trial
	}